

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void ErrorInvalidFunctionPointer(CodeGenRegVmStateContext *vmState)

{
  CodeGenRegVmContext *pCVar1;
  CodeGenRegVmContext *ctx;
  CodeGenRegVmStateContext *vmState_local;
  
  pCVar1 = vmState->ctx;
  vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
  vmState->callStackTop = vmState->callStackTop + 1;
  ExecutorX86::Stop(pCVar1->x86rvm,"ERROR: invalid function pointer");
  longjmp((__jmp_buf_tag *)vmState,1);
}

Assistant:

void ErrorInvalidFunctionPointer(CodeGenRegVmStateContext *vmState)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	vmState->callStackTop++;

	ctx.x86rvm->Stop("ERROR: invalid function pointer");
	longjmp(vmState->errorHandler, 1);
}